

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int properties_set_group_sequence(PROPERTIES_HANDLE properties,sequence_no group_sequence_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  PROPERTIES_INSTANCE *properties_instance;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar2 = 0x4263;
  }
  else {
    item_value = amqpvalue_create_uint(group_sequence_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x426b;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,0xb,item_value);
      iVar2 = 0x4271;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int properties_set_group_sequence(PROPERTIES_HANDLE properties, sequence_no group_sequence_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE group_sequence_amqp_value = amqpvalue_create_sequence_no(group_sequence_value);
        if (group_sequence_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 11, group_sequence_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(group_sequence_amqp_value);
        }
    }

    return result;
}